

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,UnaryOperator *u)

{
  Op op;
  bool bVar1;
  Expression *pEVar2;
  CompileMessage local_78;
  Type local_30;
  UnaryOperator *local_18;
  UnaryOperator *u_local;
  PostResolutionChecks *this_local;
  
  local_18 = u;
  u_local = (UnaryOperator *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,u);
  op = local_18->operation;
  pEVar2 = pool_ref<soul::AST::Expression>::operator->(&local_18->source);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])();
  bVar1 = UnaryOp::isTypeSuitable(op,&local_30);
  Type::~Type(&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  pEVar2 = pool_ref<soul::AST::Expression>::operator->(&local_18->source);
  Errors::wrongTypeForUnary<>();
  AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_78,false);
}

Assistant:

void visit (AST::UnaryOperator& u) override
        {
            super::visit (u);

            if (! UnaryOp::isTypeSuitable (u.operation, u.source->getResultType()))
                u.source->context.throwError (Errors::wrongTypeForUnary());
        }